

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::print_xformOpOrder_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,
          vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *xformOps,uint32_t indent)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  uint32_t n;
  OpType *extraout_RDX;
  OpType *extraout_RDX_00;
  OpType *op;
  ulong uVar4;
  long lVar5;
  value_type xformOp;
  stringstream ss;
  undefined1 local_248 [8];
  char *local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  undefined1 local_220 [16];
  long local_210;
  undefined1 local_208;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  local_200;
  undefined1 local_1e8;
  undefined1 local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (*(long *)(this + 8) != *(long *)this) {
    pprint::Indent_abi_cxx11_((string *)local_248,(pprint *)((ulong)xformOps & 0xffffffff),n);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)CONCAT44(local_248._4_4_,local_248._0_4_),(long)local_240)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"uniform token[] xformOpOrder = [",0x20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_248._4_4_,local_248._0_4_) != &local_238) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_248._4_4_,local_248._0_4_),
                      local_238._M_allocated_capacity + 1);
    }
    if (*(long *)(this + 8) != *(long *)this) {
      lVar5 = 0x48;
      uVar4 = 0;
      do {
        if (uVar4 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
        }
        lVar1 = *(long *)this;
        local_248[4] = *(undefined1 *)(lVar1 + -0x44 + lVar5);
        local_248._0_4_ = *(undefined4 *)(lVar1 + -0x48 + lVar5);
        local_240 = local_238._M_local_buf + 8;
        lVar2 = *(long *)(lVar1 + -0x40 + lVar5);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_240,lVar2,*(long *)(lVar1 + -0x38 + lVar5) + lVar2);
        local_210 = *(long *)(lVar1 + -0x10 + lVar5);
        lVar2 = *(long *)(lVar1 + -0x10 + lVar5);
        if (lVar2 != 0) {
          (**(code **)(lVar2 + 0x28))(lVar5 + -0x20 + lVar1,local_220);
        }
        local_208 = *(undefined1 *)(lVar1 + -8 + lVar5);
        std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::vector(&local_200,
                 (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  *)(lVar1 + lVar5));
        local_1e8 = *(undefined1 *)(lVar1 + 0x18 + lVar5);
        local_1e0 = *(undefined1 *)(lVar1 + 0x20 + lVar5);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\"",1);
        op = extraout_RDX;
        if (local_248[4] == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"!invert!",8);
          op = extraout_RDX_00;
        }
        to_string_abi_cxx11_(&local_1d8,(tinyusdz *)local_248,op);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if (local_238._M_allocated_capacity != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,":",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_240,local_238._M_allocated_capacity);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\"",1);
        std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::~vector(&local_200);
        if (local_210 != 0) {
          (**(code **)(local_210 + 0x20))(local_220);
          local_210 = 0;
        }
        if (local_240 != local_238._M_local_buf + 8) {
          operator_delete(local_240,local_238._8_8_ + 1);
        }
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x70;
      } while (uVar4 < (ulong)((*(long *)(this + 8) - *(long *)this >> 4) * 0x6db6db6db6db6db7));
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]\n",2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_xformOpOrder(const std::vector<XformOp> &xformOps,
                               const uint32_t indent) {
  std::stringstream ss;

  if (xformOps.size()) {
    ss << pprint::Indent(indent) << "uniform token[] xformOpOrder = [";
    for (size_t i = 0; i < xformOps.size(); i++) {
      if (i > 0) {
        ss << ", ";
      }

      auto xformOp = xformOps[i];
      ss << "\"";
      if (xformOp.inverted) {
        ss << "!invert!";
      }
      ss << to_string(xformOp.op_type);
      if (!xformOp.suffix.empty()) {
        ss << ":" << xformOp.suffix;
      }
      ss << "\"";
    }
    ss << "]\n";
  }

  return ss.str();
}